

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paseto_v2_local.c
# Opt level: O3

uint8_t * paseto_v2_local_decrypt
                    (char *encoded,size_t *message_len,uint8_t *key,uint8_t **footer,
                    size_t *footer_len)

{
  char *pcVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  uint8_t *data;
  size_t sVar5;
  int *piVar6;
  uint8_t *puVar7;
  uint8_t *__dest;
  size_t sVar8;
  uint8_t *data_00;
  size_t decoded_footer_len;
  uint8_t *local_68;
  unsigned_long_long internal_message_len;
  char *encoded_footer;
  size_t decoded_len;
  uint8_t *local_48;
  pre_auth pa;
  
  if ((((message_len == (size_t *)0x0 || encoded == (char *)0x0) || key == (uint8_t *)0x0) ||
      (sVar4 = strlen(encoded), sVar4 < 0x3f)) ||
     (encoded[8] != '.' || *(long *)encoded != 0x6c61636f6c2e3276)) {
LAB_0010168f:
    piVar6 = __errno_location();
    *piVar6 = 0x16;
  }
  else {
    sVar4 = strlen(encoded + 9);
    data = (uint8_t *)malloc(sVar4);
    if (data != (uint8_t *)0x0) {
      iVar3 = sodium_base642bin(data,sVar4,encoded + 9,sVar4,0,&decoded_len,&encoded_footer,7);
      pcVar1 = encoded_footer;
      if ((iVar3 != 0) || (sVar4 < 0x28)) {
LAB_0010168a:
        free(data);
        goto LAB_0010168f;
      }
      sVar5 = strlen(encoded_footer);
      decoded_footer_len = 0;
      if (sVar5 < 2) {
        sVar8 = 0x21;
        data_00 = (uint8_t *)0x0;
      }
      else {
        encoded_footer = pcVar1 + 1;
        data_00 = data + decoded_len;
        iVar3 = sodium_base642bin(data_00,sVar4 - decoded_len,encoded_footer,sVar5 - 1,0,
                                  &decoded_footer_len,0,7);
        if (iVar3 != 0) goto LAB_0010168a;
        sVar8 = decoded_footer_len + 0x21;
      }
      _Var2 = pre_auth_init(&pa,3,sVar8);
      if (_Var2) {
        pre_auth_append(&pa,"v2.local.",9);
        pre_auth_append(&pa,data,0x18);
        pre_auth_append(&pa,data_00,decoded_footer_len);
        local_68 = pa.base;
        local_48 = pa.current;
        puVar7 = (uint8_t *)malloc(decoded_len - 0xf);
        if (puVar7 != (uint8_t *)0x0) {
          iVar3 = crypto_aead_xchacha20poly1305_ietf_decrypt
                            (puVar7,&internal_message_len,0,data + 0x18,decoded_len - 0x18,local_68,
                             (long)local_48 - (long)local_68,data,key);
          if (iVar3 == 0) {
            puVar7[internal_message_len] = '\0';
            free(pa.base);
            sVar8 = decoded_footer_len;
            if (((footer_len == (size_t *)0x0) || (footer == (uint8_t **)0x0)) ||
               (data_00 == (uint8_t *)0x0)) {
              if (footer != (uint8_t **)0x0) {
                *footer = (uint8_t *)0x0;
              }
              if (footer_len == (size_t *)0x0) goto LAB_00101846;
              sVar8 = 0;
            }
            else {
              __dest = (uint8_t *)malloc(decoded_footer_len + 1);
              if (__dest == (uint8_t *)0x0) {
                free(data);
                data = puVar7;
                goto LAB_001017b8;
              }
              memcpy(__dest,data_00,sVar8);
              __dest[sVar8] = '\0';
              *footer = __dest;
            }
            *footer_len = sVar8;
LAB_00101846:
            free(data);
            *message_len = internal_message_len;
            return puVar7;
          }
          free(data);
          free(pa.base);
          data = puVar7;
          goto LAB_0010168a;
        }
        free(data);
        data = local_68;
      }
LAB_001017b8:
      free(data);
    }
    piVar6 = __errno_location();
    *piVar6 = 0xc;
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *paseto_v2_local_decrypt(
        const char *encoded, size_t *message_len,
        const uint8_t key[paseto_v2_LOCAL_KEYBYTES],
        uint8_t **footer, size_t *footer_len) {
    if (!encoded || !message_len || !key) {
        errno = EINVAL;
        return NULL;
    }

    if (strlen(encoded) < header_len + sodium_base64_ENCODED_LEN(
                paseto_v2_LOCAL_NONCEBYTES + mac_len,
                sodium_base64_VARIANT_URLSAFE_NO_PADDING) - 1
            || memcmp(encoded, header, header_len) != 0) {
        errno = EINVAL;
        return NULL;
    }

    encoded += header_len;

    const size_t encoded_len = strlen(encoded);
    size_t decoded_len;
    uint8_t *decoded = malloc(encoded_len);
    if (!decoded) {
        errno = ENOMEM;
        return NULL;
    }

    const char *encoded_footer;
    if (sodium_base642bin(
            decoded, encoded_len,
            encoded, encoded_len,
            NULL, &decoded_len,
            &encoded_footer,
            sodium_base64_VARIANT_URLSAFE_NO_PADDING) != 0) {
        free(decoded);
        errno = EINVAL;
        return NULL;
    }

    const uint8_t *nonce = decoded;
    // after base64 decoding there should be at least enough data to store the
    // nonce as well as the signature
    if (encoded_len < paseto_v2_LOCAL_NONCEBYTES + mac_len) {
        free(decoded);
        errno = EINVAL;
        return NULL;
    }

    size_t encoded_footer_len = strlen(encoded_footer);
    uint8_t *decoded_footer = NULL;
    size_t decoded_footer_len = 0;

    if (encoded_footer_len > 1) {
        // footer present and one or more bytes long
        // skip '.'
        encoded_footer_len--;
        encoded_footer++;

        // use memory after the decoded data for the decoded footer
        decoded_footer = decoded + decoded_len;

        if (sodium_base642bin(
                decoded_footer, encoded_len - decoded_len,
                encoded_footer, encoded_footer_len,
                NULL, &decoded_footer_len,
                NULL,
                sodium_base64_VARIANT_URLSAFE_NO_PADDING) != 0) {
            free(decoded);
            errno = EINVAL;
            return NULL;
        }
    }

    struct pre_auth pa;
    if (!pre_auth_init(&pa, 3,
            header_len + paseto_v2_LOCAL_NONCEBYTES + decoded_footer_len)) {
        free(decoded);
        errno = ENOMEM;
        return NULL;
    }
    pre_auth_append(&pa, header, header_len);
    pre_auth_append(&pa, nonce, paseto_v2_LOCAL_NONCEBYTES);
    pre_auth_append(&pa, decoded_footer, decoded_footer_len);
    const size_t pre_auth_len = pa.current - pa.base;


    uint8_t *message = malloc(decoded_len - mac_len + 1);
    if (!message) {
        free(decoded);
        free(pa.base);
        errno = ENOMEM;
        return NULL;
    }
    uint8_t *ct = decoded + paseto_v2_LOCAL_NONCEBYTES;
    const unsigned long long ct_len = decoded_len - paseto_v2_LOCAL_NONCEBYTES;
    unsigned long long internal_message_len;
    if (crypto_aead_xchacha20poly1305_ietf_decrypt(
            message, &internal_message_len,
            NULL,
            ct, ct_len,
            pa.base, pre_auth_len,
            nonce, key) != 0) {
        free(decoded);
        free(pa.base);
        free(message);
        errno = EINVAL;
        return NULL;
    }

    // include a null terminator for convenience
    message[internal_message_len] = '\0';

    free(pa.base);

    if (decoded_footer && footer && footer_len) {
        uint8_t *internal_footer = malloc(decoded_footer_len + 1);
        if (!internal_footer) {
            free(decoded);
            free(message);
            errno = ENOMEM;
            return NULL;
        }
        memcpy(internal_footer, decoded_footer, decoded_footer_len);
        internal_footer[decoded_footer_len] = '\0';
        *footer = internal_footer;
        *footer_len = decoded_footer_len;
    } else {
        if (footer) *footer = NULL;
        if (footer_len) *footer_len = 0;
    }

    free(decoded);

    *message_len = internal_message_len;

    return message;
}